

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O0

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::splitExtBorders
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  I_00;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  *in_RSI;
  Offset prev_end;
  iterator prev;
  iterator it;
  iterator last;
  iterator ge;
  bool changed;
  map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
  *in_stack_fffffffffffffec8;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  *in_stack_fffffffffffffed0;
  Offset *in_stack_fffffffffffffed8;
  Offset local_f0;
  type local_e8;
  _Base_ptr local_e0;
  _Base_ptr local_d8;
  Offset local_d0;
  _Base_ptr local_c8;
  _Self local_c0;
  _Base_ptr local_b8;
  _Self local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Self local_88;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *in_stack_ffffffffffffff80;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  in_stack_ffffffffffffff88;
  Offset in_stack_ffffffffffffff90;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  in_stack_ffffffffffffff98;
  _Self local_30;
  _Self local_28;
  byte local_19;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  *local_18;
  bool local_1;
  
  local_19 = 0;
  local_18 = in_RSI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
       ::lower_bound(in_stack_fffffffffffffec8,(key_type *)0x184fc9);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
       ::end(in_stack_fffffffffffffec8);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    _get_last((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)in_stack_fffffffffffffec8);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x185020);
    bVar1 = Offset::operator>(&(ppVar2->first).end,(Offset *)(local_18 + 1));
    if (bVar1) {
      DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
      splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
      local_19 = 1;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x1850da);
    bVar1 = Offset::operator>=(&(ppVar2->first).end,(Offset *)local_18);
    if (bVar1) {
      Offset::Offset((Offset *)&stack0xffffffffffffff90,1);
      I_00._M_node = (_Base_ptr)
                     Offset::operator-((Offset *)local_18,(Offset *)in_stack_fffffffffffffed0);
      DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
      splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                (in_stack_ffffffffffffff80,I_00,in_stack_ffffffffffffff90,
                 (_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                  )local_28._M_node);
      local_19 = 1;
    }
  }
  else {
    local_88._M_node = local_28._M_node;
    do {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                             *)0x1851ca);
      bVar1 = Offset::operator<=((Offset *)ppVar2,(Offset *)(local_18 + 1));
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                             *)0x1851f4);
      bVar1 = Offset::operator>(&(ppVar2->first).end,(Offset *)(local_18 + 1));
      if (bVar1) {
        local_98 = local_88._M_node;
        local_a0 = local_18[1]._M_node;
        local_a8 = (_Base_ptr)
                   std::
                   map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                   ::end(in_stack_fffffffffffffec8);
        local_90 = (_Base_ptr)
                   DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
                   splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                             (in_stack_ffffffffffffff80,in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        local_19 = 1;
        local_88._M_node = local_90;
        break;
      }
      std::
      _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator++(in_stack_fffffffffffffed0);
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
           ::end(in_stack_fffffffffffffec8);
      bVar1 = std::operator==(&local_88,&local_b0);
    } while (!bVar1);
    if ((local_19 & 1) != 0) {
      local_b8 = (_Base_ptr)
                 std::
                 map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                 ::lower_bound(in_stack_fffffffffffffec8,(key_type *)0x1852e9);
      local_28._M_node = local_b8;
    }
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
         ::begin(in_stack_fffffffffffffec8);
    bVar1 = std::operator!=(&local_28,&local_c0);
    if (bVar1) {
      local_c8 = local_28._M_node;
      std::
      _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator--(in_stack_fffffffffffffed0);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                             *)0x18534c);
      local_d0.offset = (ppVar2->first).end.offset;
      bVar1 = Offset::operator>=(&local_d0,(Offset *)local_18);
      if (bVar1) {
        local_e0 = local_c8;
        in_stack_fffffffffffffed0 = local_18;
        Offset::Offset(&local_f0,1);
        local_e8 = (type)Offset::operator-(in_stack_fffffffffffffed8,
                                           (Offset *)in_stack_fffffffffffffed0);
        local_d8 = (_Base_ptr)
                   DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
                   splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                             (in_stack_ffffffffffffff80,in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        local_19 = 1;
        local_28._M_node = local_d8;
      }
      bVar1 = Offset::operator>(&local_d0,(Offset *)(local_18 + 1));
      if (bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
        ::operator++(in_stack_fffffffffffffed0);
        std::
        map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
        ::end(in_stack_fffffffffffffec8);
        DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
        splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88);
        local_19 = 1;
      }
    }
  }
  local_1 = (bool)(local_19 & 1);
  return local_1;
}

Assistant:

bool splitExtBorders(const IntervalT &I) {
        assert(!_mapping.empty());
        bool changed = false;

        auto ge = _mapping.lower_bound(I);
        if (ge == _mapping.end()) {
            // the last interval must start somewhere to the
            // left from our new interval
            auto last = _get_last();
            assert(last->first.start < I.start);

            if (last->first.end > I.end) {
                last = splitIntervalHint(last, I.end, ge);
                changed |= true;
            }

            if (last->first.end >= I.start) {
                splitIntervalHint(last, I.start - 1, ge);
                changed |= true;
            }
            return changed;
        }

        // we found an interval starting at I.start
        // or later
        assert(ge->first.start >= I.start);
        // FIXME: optimize this...
        //  add _find_le to find the "closest" interval from the right
        //  (maybe iterating like this is faster, though)
        auto it = ge;
        while (it->first.start <= I.end) {
            if (it->first.end > I.end) {
                it = splitIntervalHint(it, I.end, _mapping.end());
                changed = true;
                break;
            }
            ++it;
            if (it == _mapping.end())
                break;
        }

        // we may have also overlap from the previous interval
        if (changed)
            ge = _mapping.lower_bound(I);
        if (ge != _mapping.begin()) {
            auto prev = ge;
            --prev;
            auto prev_end = prev->first.end;
            if (prev_end >= I.start) {
                ge = splitIntervalHint(prev, I.start - 1, ge);
                changed = true;
            }
            // is the new interval entirely covered by the previous?
            if (prev_end > I.end) {
                // get the higher of the new intervals
                ++ge;
                assert(ge != _mapping.end());
                assert(ge->first.end == prev_end);
#ifndef NDEBUG
                auto check =
#endif
                        splitIntervalHint(ge, I.end, _mapping.end());
                assert(check->first == I);
                changed = true;
            }
        }

        return changed;
    }